

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O1

void __thiscall RegressionTree::regressionTreeQueries(RegressionTree *this)

{
  _WordT *p_Var1;
  iterator iVar2;
  ulong *puVar3;
  pointer pbVar4;
  Query *pQVar5;
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *pvVar6;
  Function *pFVar7;
  bitset<1500UL> *pbVar8;
  Query *pQVar9;
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *pvVar10;
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *this_00;
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *this_01;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  QueryThresholdPair qtPair;
  QueryThresholdPair local_80;
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *local_60;
  vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *local_58;
  Query *local_50;
  long local_48;
  Query *local_40;
  Query *local_38;
  
  pQVar5 = (Query *)operator_new(0x30);
  pQVar5->_rootID = 0;
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar6 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)operator_new(0x30);
  *(undefined8 *)pvVar6 = 0;
  *(undefined8 *)(pvVar6 + 8) = 0;
  *(undefined8 *)(pvVar6 + 0x10) = 0;
  *(undefined8 *)(pvVar6 + 0x18) = 0;
  *(undefined8 *)(pvVar6 + 0x20) = 0;
  *(undefined8 *)(pvVar6 + 0x28) = 0;
  pFVar7 = (Function *)operator_new(0x30);
  (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  *(undefined8 *)&pFVar7->_operation = 0;
  pFVar7->_parameter = (double *)0x0;
  *(undefined8 *)&pFVar7->_dynamic = 0;
  (pFVar7->_name)._M_dataplus._M_p = (pointer)0x0;
  pbVar8 = (this->_candidateMask).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start + 100;
  iVar2._M_current = (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0];
  if (iVar2._M_current == (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1]) {
    std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
    _M_realloc_insert<std::bitset<1500ul>const&>
              ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pQVar5,iVar2,
               pbVar8);
  }
  else {
    memcpy(iVar2._M_current,pbVar8,0xc0);
    (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = (_WordT)(iVar2._M_current + 1);
  }
  pbVar8 = (this->_candidateMask).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start + 100;
  iVar2._M_current = *(bitset<1500UL> **)(pvVar6 + 8);
  if (iVar2._M_current == *(bitset<1500UL> **)(pvVar6 + 0x10)) {
    std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
    _M_realloc_insert<std::bitset<1500ul>const&>(pvVar6,iVar2,pbVar8);
  }
  else {
    memcpy(iVar2._M_current,pbVar8,0xc0);
    *(bitset<1500UL> **)(pvVar6 + 8) = iVar2._M_current + 1;
  }
  **(ulong **)pvVar6 = **(ulong **)pvVar6 | 1;
  pbVar8 = (this->_candidateMask).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start + 100;
  iVar2._M_current = (bitset<1500UL> *)(pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1];
  if (iVar2._M_current == *(bitset<1500UL> **)&pFVar7->_operation) {
    std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
    _M_realloc_insert<std::bitset<1500ul>const&>
              ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pFVar7,iVar2,
               pbVar8);
  }
  else {
    memcpy(iVar2._M_current,pbVar8,0xc0);
    (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = (_WordT)(iVar2._M_current + 1);
  }
  puVar3 = (ulong *)(pFVar7->_fVars).super__Base_bitset<2UL>._M_w[0];
  *puVar3 = *puVar3 | 2;
  pQVar9 = (Query *)operator_new(0x30);
  (pQVar9->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar9->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar9->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar9->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar9->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pQVar9->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  local_80.query = pQVar5;
  local_80.varID = (size_t)pvVar6;
  local_80.function = pFVar7;
  std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_assign_aux<Aggregate*const*>
            ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar9->_aggregates,&local_80);
  local_50 = pQVar9;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar9);
  pvVar6 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)0x0;
  do {
    uVar12 = (ulong)pvVar6 >> 6;
    uVar11 = 1L << ((byte)pvVar6 & 0x3f);
    if (((this->_features).super__Base_bitset<2UL>._M_w[uVar12] >> ((ulong)pvVar6 & 0x3f) & 1) != 0)
    {
      if (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[uVar12] & uVar11) == 0) {
        local_48 = (long)pvVar6 * 0xc0;
        uVar11 = 0;
        do {
          pbVar4 = (this->_candidateMask).
                   super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = uVar11 >> 6;
          uVar12 = 1L << ((byte)uVar11 & 0x3f);
          if ((*(ulong *)((long)(pbVar4->super__Base_bitset<24UL>)._M_w + uVar13 * 8 + local_48) >>
               (uVar11 & 0x3f) & 1) != 0) {
            pQVar5 = (Query *)operator_new(0x30);
            pQVar5->_rootID = 0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar10 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                      operator_new(0x30);
            *(undefined8 *)pvVar10 = 0;
            *(undefined8 *)(pvVar10 + 8) = 0;
            *(undefined8 *)(pvVar10 + 0x10) = 0;
            *(undefined8 *)(pvVar10 + 0x18) = 0;
            *(undefined8 *)(pvVar10 + 0x20) = 0;
            *(undefined8 *)(pvVar10 + 0x28) = 0;
            pFVar7 = (Function *)operator_new(0x30);
            (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            *(undefined8 *)&pFVar7->_operation = 0;
            pFVar7->_parameter = (double *)0x0;
            *(undefined8 *)&pFVar7->_dynamic = 0;
            (pFVar7->_name)._M_dataplus._M_p = (pointer)0x0;
            pbVar8 = pbVar4 + 100;
            iVar2._M_current = (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0];
            if (iVar2._M_current ==
                (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1]) {
              std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
              _M_realloc_insert<std::bitset<1500ul>const&>
                        ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pQVar5,
                         iVar2,pbVar8);
            }
            else {
              memcpy(iVar2._M_current,pbVar8,0xc0);
              (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = (_WordT)(iVar2._M_current + 1);
            }
            puVar3 = (ulong *)(pQVar5->_rootID + uVar13 * 8);
            *puVar3 = *puVar3 | uVar12;
            pbVar8 = (this->_candidateMask).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + 100;
            iVar2._M_current = *(bitset<1500UL> **)(pvVar10 + 8);
            local_38 = pQVar5;
            if (iVar2._M_current == *(bitset<1500UL> **)(pvVar10 + 0x10)) {
              std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
              _M_realloc_insert<std::bitset<1500ul>const&>(pvVar10,iVar2,pbVar8);
            }
            else {
              memcpy(iVar2._M_current,pbVar8,0xc0);
              *(bitset<1500UL> **)(pvVar10 + 8) = iVar2._M_current + 1;
            }
            puVar3 = *(ulong **)pvVar10;
            *puVar3 = *puVar3 | 1;
            puVar3[uVar13] = puVar3[uVar13] | uVar12;
            pbVar8 = (this->_candidateMask).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + 100;
            iVar2._M_current = (bitset<1500UL> *)(pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1];
            if (iVar2._M_current == *(bitset<1500UL> **)&pFVar7->_operation) {
              std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
              _M_realloc_insert<std::bitset<1500ul>const&>
                        ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pFVar7,
                         iVar2,pbVar8);
            }
            else {
              memcpy(iVar2._M_current,pbVar8,0xc0);
              (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = (_WordT)(iVar2._M_current + 1);
            }
            puVar3 = (ulong *)(pFVar7->_fVars).super__Base_bitset<2UL>._M_w[0];
            *puVar3 = *puVar3 | 2;
            puVar3[uVar13] = puVar3[uVar13] | uVar12;
            pQVar5 = (Query *)operator_new(0x30);
            pQVar5->_rootID = 0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            this_00 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                      operator_new(0x30);
            *(undefined8 *)this_00 = 0;
            *(undefined8 *)(this_00 + 8) = 0;
            *(undefined8 *)(this_00 + 0x10) = 0;
            *(undefined8 *)(this_00 + 0x18) = 0;
            *(undefined8 *)(this_00 + 0x20) = 0;
            *(undefined8 *)(this_00 + 0x28) = 0;
            this_01 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                      operator_new(0x30);
            *(undefined8 *)this_01 = 0;
            *(undefined8 *)(this_01 + 8) = 0;
            *(undefined8 *)(this_01 + 0x10) = 0;
            *(undefined8 *)(this_01 + 0x18) = 0;
            *(undefined8 *)(this_01 + 0x20) = 0;
            *(undefined8 *)(this_01 + 0x28) = 0;
            pbVar8 = (this->_candidateMask).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + 100;
            iVar2._M_current = (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0];
            if (iVar2._M_current ==
                (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1]) {
              std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
              _M_realloc_insert<std::bitset<1500ul>const&>
                        ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pQVar5,
                         iVar2,pbVar8);
            }
            else {
              memcpy(iVar2._M_current,pbVar8,0xc0);
              (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = (_WordT)(iVar2._M_current + 1);
            }
            uVar12 = this->_complementFunction[uVar11];
            if (0x5db < uVar12) {
LAB_00155f4f:
              std::__throw_out_of_range_fmt
                        ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar12,
                         0x5dc);
            }
            puVar3 = (ulong *)(pQVar5->_rootID + (uVar12 >> 6) * 8);
            *puVar3 = *puVar3 | 1L << ((byte)uVar12 & 0x3f);
            pbVar8 = (this->_candidateMask).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + 100;
            iVar2._M_current = *(bitset<1500UL> **)(this_00 + 8);
            local_40 = pQVar5;
            if (iVar2._M_current == *(bitset<1500UL> **)(this_00 + 0x10)) {
              std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
              _M_realloc_insert<std::bitset<1500ul>const&>(this_00,iVar2,pbVar8);
            }
            else {
              memcpy(iVar2._M_current,pbVar8,0xc0);
              *(bitset<1500UL> **)(this_00 + 8) = iVar2._M_current + 1;
            }
            puVar3 = *(ulong **)this_00;
            *puVar3 = *puVar3 | 1;
            uVar12 = this->_complementFunction[uVar11];
            if (0x5db < uVar12) goto LAB_00155f4f;
            puVar3[uVar12 >> 6] = puVar3[uVar12 >> 6] | 1L << ((byte)uVar12 & 0x3f);
            pbVar8 = (this->_candidateMask).
                     super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + 100;
            iVar2._M_current = *(bitset<1500UL> **)(this_01 + 8);
            if (iVar2._M_current == *(bitset<1500UL> **)(this_01 + 0x10)) {
              std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
              _M_realloc_insert<std::bitset<1500ul>const&>(this_01,iVar2,pbVar8);
            }
            else {
              memcpy(iVar2._M_current,pbVar8,0xc0);
              *(bitset<1500UL> **)(this_01 + 8) = iVar2._M_current + 1;
            }
            puVar3 = *(ulong **)this_01;
            *puVar3 = *puVar3 | 2;
            uVar12 = this->_complementFunction[uVar11];
            if (0x5db < uVar12) goto LAB_00155f4f;
            puVar3[uVar12 >> 6] = puVar3[uVar12 >> 6] | 1L << ((byte)uVar12 & 0x3f);
            pQVar5 = (Query *)operator_new(0x30);
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
            (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pQVar5->_rootID = this->_queryRootIndex[(long)pvVar6];
            local_80.query = local_38;
            local_80.complementQuery = local_40;
            local_80.varID = (size_t)pvVar10;
            local_80.function = pFVar7;
            local_60 = this_00;
            local_58 = this_01;
            std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_assign_aux<Aggregate*const*>
                      ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar5->_aggregates,
                       &local_80,&local_50);
            QueryCompiler::addQuery
                      ((this->_compiler).
                       super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pQVar5);
            this->_varToQueryMap[(long)pvVar6] = pQVar5;
            local_80.complementQuery = (Query *)0x0;
            local_80.query = pQVar5;
            local_80.varID = (size_t)pvVar6;
            local_80.function =
                 QueryCompiler::getFunction
                           ((this->_compiler).
                            super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            uVar11);
            if (queryToThreshold.
                super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                queryToThreshold.
                super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<QueryThresholdPair,std::allocator<QueryThresholdPair>>::
              _M_realloc_insert<QueryThresholdPair_const&>
                        ((vector<QueryThresholdPair,std::allocator<QueryThresholdPair>> *)
                         &queryToThreshold,
                         (iterator)
                         queryToThreshold.
                         super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_80);
            }
            else {
              (queryToThreshold.
               super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
               super__Vector_impl_data._M_finish)->function = local_80.function;
              (queryToThreshold.
               super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
               super__Vector_impl_data._M_finish)->complementQuery = local_80.complementQuery;
              (queryToThreshold.
               super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
               super__Vector_impl_data._M_finish)->query = local_80.query;
              (queryToThreshold.
               super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
               super__Vector_impl_data._M_finish)->varID = local_80.varID;
              queryToThreshold.
              super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   queryToThreshold.
                   super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != 0x5dc);
      }
      else {
        pQVar5 = (Query *)operator_new(0x30);
        pQVar5->_rootID = 0;
        (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pQVar5->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar10 = (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)
                  operator_new(0x30);
        *(undefined8 *)pvVar10 = 0;
        *(undefined8 *)(pvVar10 + 8) = 0;
        *(undefined8 *)(pvVar10 + 0x10) = 0;
        *(undefined8 *)(pvVar10 + 0x18) = 0;
        *(undefined8 *)(pvVar10 + 0x20) = 0;
        *(undefined8 *)(pvVar10 + 0x28) = 0;
        pFVar7 = (Function *)operator_new(0x30);
        (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        *(undefined8 *)&pFVar7->_operation = 0;
        pFVar7->_parameter = (double *)0x0;
        *(undefined8 *)&pFVar7->_dynamic = 0;
        (pFVar7->_name)._M_dataplus._M_p = (pointer)0x0;
        pbVar8 = (this->_candidateMask).
                 super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + 100;
        iVar2._M_current = (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0];
        if (iVar2._M_current == (bitset<1500UL> *)(pQVar5->_fVars).super__Base_bitset<2UL>._M_w[1])
        {
          std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
          _M_realloc_insert<std::bitset<1500ul>const&>
                    ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pQVar5,iVar2
                     ,pbVar8);
        }
        else {
          memcpy(iVar2._M_current,pbVar8,0xc0);
          (pQVar5->_fVars).super__Base_bitset<2UL>._M_w[0] = (_WordT)(iVar2._M_current + 1);
        }
        pbVar8 = (this->_candidateMask).
                 super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + 100;
        iVar2._M_current = *(bitset<1500UL> **)(pvVar10 + 8);
        if (iVar2._M_current == *(bitset<1500UL> **)(pvVar10 + 0x10)) {
          std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
          _M_realloc_insert<std::bitset<1500ul>const&>(pvVar10,iVar2,pbVar8);
        }
        else {
          memcpy(iVar2._M_current,pbVar8,0xc0);
          *(bitset<1500UL> **)(pvVar10 + 8) = iVar2._M_current + 1;
        }
        **(ulong **)pvVar10 = **(ulong **)pvVar10 | 1;
        pbVar8 = (this->_candidateMask).
                 super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start + 100;
        iVar2._M_current = (bitset<1500UL> *)(pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1];
        if (iVar2._M_current == *(bitset<1500UL> **)&pFVar7->_operation) {
          std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
          _M_realloc_insert<std::bitset<1500ul>const&>
                    ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pFVar7,iVar2
                     ,pbVar8);
        }
        else {
          memcpy(iVar2._M_current,pbVar8,0xc0);
          (pFVar7->_fVars).super__Base_bitset<2UL>._M_w[1] = (_WordT)(iVar2._M_current + 1);
        }
        puVar3 = (ulong *)(pFVar7->_fVars).super__Base_bitset<2UL>._M_w[0];
        *puVar3 = *puVar3 | 2;
        pQVar9 = (Query *)operator_new(0x30);
        (pQVar9->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
        (pQVar9->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
        (pQVar9->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pQVar9->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pQVar9->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pQVar9->_rootID = this->_queryRootIndex[(long)pvVar6];
        local_80.query = pQVar5;
        local_80.varID = (size_t)pvVar10;
        local_80.function = pFVar7;
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_assign_aux<Aggregate*const*>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar9->_aggregates,&local_80,
                   &local_80.complementQuery);
        p_Var1 = (pQVar9->_fVars).super__Base_bitset<2UL>._M_w + uVar12;
        *p_Var1 = *p_Var1 | uVar11;
        QueryCompiler::addQuery
                  ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,pQVar9);
        local_80.function = (Function *)0x0;
        local_80.complementQuery = local_50;
        this->_varToQueryMap[(long)pvVar6] = pQVar9;
        local_80.query = pQVar9;
        if (queryToThreshold.
            super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            queryToThreshold.
            super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_80.varID = (size_t)pvVar6;
          std::vector<QueryThresholdPair,std::allocator<QueryThresholdPair>>::
          _M_realloc_insert<QueryThresholdPair_const&>
                    ((vector<QueryThresholdPair,std::allocator<QueryThresholdPair>> *)
                     &queryToThreshold,
                     (iterator)
                     queryToThreshold.
                     super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_80);
        }
        else {
          (queryToThreshold.
           super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
           super__Vector_impl_data._M_finish)->function = (Function *)0x0;
          (queryToThreshold.
           super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
           super__Vector_impl_data._M_finish)->complementQuery = local_50;
          (queryToThreshold.
           super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
           super__Vector_impl_data._M_finish)->query = pQVar9;
          (queryToThreshold.
           super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
           super__Vector_impl_data._M_finish)->varID = (size_t)pvVar6;
          queryToThreshold.
          super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
          super__Vector_impl_data._M_finish =
               queryToThreshold.
               super__Vector_base<QueryThresholdPair,_std::allocator<QueryThresholdPair>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
          local_80.varID = (size_t)pvVar6;
        }
      }
    }
    pvVar6 = pvVar6 + 1;
    if (pvVar6 == (vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)0x64) {
      return;
    }
  } while( true );
}

Assistant:

void RegressionTree::regressionTreeQueries()
{

    Aggregate* countC = new Aggregate();
    Aggregate* countL = new Aggregate();
    Aggregate* countQ = new Aggregate();
                
    /* Q_C */
    countC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                            
    /* Q_L */
    countL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
    countL->_agg[0].set(0);
        
    /* Q_Q */
    countQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
    countQ->_agg[0].set(1);

    // We add an additional query without free vars to compute the
    // complement of each threshold 
    Query* countQuery = new Query();
    countQuery->_rootID = _td->_root->_id;  
    countQuery->_aggregates = {countC,countL,countQ};

    _compiler->addQuery(countQuery);

    for (size_t var=0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_features[var])
        {
            if (_categoricalFeatures[var])
            {
                Aggregate* aggC = new Aggregate();
                Aggregate* aggL = new Aggregate();
                Aggregate* aggQ = new Aggregate();
                
                /* Q_C */
                aggC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                            
                /* Q_L */
                aggL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                aggL->_agg[0].set(0);
        
                /* Q_Q */
                aggQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                aggQ->_agg[0].set(1);

                
                Query* query = new Query();
                query->_rootID = _queryRootIndex[var];  
                query->_aggregates = {aggC,aggL,aggQ};
                query->_fVars.set(var);
                
                _compiler->addQuery(query);


                QueryThresholdPair qtPair;
                qtPair.query = query;
                qtPair.varID = var;
                qtPair.function = nullptr;
                qtPair.complementQuery = countQuery;
                
                _varToQueryMap[var] = query;

                queryToThreshold.push_back(qtPair);
            }
            else /* Continuous Variable */
            {
                /* We create a query for each threshold for this variable */ 
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
                {
                    if (!_candidateMask[var][f])
                        continue;
                    
                    Aggregate* aggC = new Aggregate();
                    Aggregate* aggL = new Aggregate();
                    Aggregate* aggQ = new Aggregate();
        
                    /* Q_C */
                    aggC->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggC->_agg[0].set(f);

                    /* Q_L */
                    aggL->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggL->_agg[0].set(0);
                    aggL->_agg[0].set(f);
        
                    /* Q_Q */
                    aggQ->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggQ->_agg[0].set(1);
                    aggQ->_agg[0].set(f);
                                        
                    Aggregate* aggC_complement = new Aggregate();
                    Aggregate* aggL_complement = new Aggregate();
                    Aggregate* aggQ_complement = new Aggregate();
        
                    /* Q_C */
                    aggC_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggC_complement->_agg[0].set(_complementFunction[f]);

                    /* Q_L */
                    aggL_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggL_complement->_agg[0].set(0);
                    aggL_complement->_agg[0].set(_complementFunction[f]);
        
                    /* Q_Q */
                    aggQ_complement->_agg.push_back(_candidateMask[NUM_OF_VARIABLES]);
                    aggQ_complement->_agg[0].set(1);
                    aggQ_complement->_agg[0].set(_complementFunction[f]);

                    Query* query = new Query();
                    query->_rootID =  _queryRootIndex[var]; // _td->_root->_id;
                    query->_aggregates = {aggC,aggL,aggQ,
                         aggC_complement,aggL_complement,aggQ_complement};
                    
                    _compiler->addQuery(query);
                    _varToQueryMap[var] = query;
                    
                    QueryThresholdPair qtPair;
                    qtPair.query = query;
                    qtPair.varID = var;
                    qtPair.function = _compiler->getFunction(f);
                    
                    queryToThreshold.push_back(qtPair);
                }
            }
        }
    }
}